

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.h
# Opt level: O2

BIT_DStream_status BIT_reloadDStreamFast(BIT_DStream_t *bitD)

{
  uint uVar1;
  size_t *psVar2;
  
  if (bitD->ptr < bitD->limitPtr) {
    return BIT_DStream_overflow;
  }
  uVar1 = bitD->bitsConsumed;
  if (uVar1 < 0x41) {
    psVar2 = (size_t *)(bitD->ptr + -(ulong)(uVar1 >> 3));
    bitD->ptr = (char *)psVar2;
    bitD->bitsConsumed = uVar1 & 7;
    bitD->bitContainer = *psVar2;
    return BIT_DStream_unfinished;
  }
  __assert_fail("bitD->bitsConsumed <= sizeof(bitD->bitContainer)*8",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/../common/bitstream.h"
                ,0x185,"BIT_DStream_status BIT_reloadDStreamFast(BIT_DStream_t *)");
}

Assistant:

MEM_STATIC BIT_DStream_status BIT_reloadDStreamFast(BIT_DStream_t* bitD)
{
    if (UNLIKELY(bitD->ptr < bitD->limitPtr))
        return BIT_DStream_overflow;
    assert(bitD->bitsConsumed <= sizeof(bitD->bitContainer)*8);
    bitD->ptr -= bitD->bitsConsumed >> 3;
    bitD->bitsConsumed &= 7;
    bitD->bitContainer = MEM_readLEST(bitD->ptr);
    return BIT_DStream_unfinished;
}